

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRestruct.c
# Opt level: O1

void Abc_NodeEdgeDsdPushOrdered(Dec_Graph_t *pGraph,Vec_Int_t *vEdges,int Edge)

{
  uint uVar1;
  int *piVar2;
  Dec_Node_t *pDVar3;
  bool bVar4;
  long lVar5;
  
  lVar5 = (long)vEdges->nSize;
  vEdges->nSize = vEdges->nSize + 1;
  if (0 < lVar5) {
    piVar2 = vEdges->pArray;
    pDVar3 = pGraph->pNodes;
    do {
      uVar1 = piVar2[lVar5 + -1];
      if ((*(uint *)&pDVar3[(uint)Edge >> 1 & 0x3fffffff].field_0x10 & 0x3fff) <
          (*(uint *)&pDVar3[uVar1 >> 1 & 0x3fffffff].field_0x10 & 0x3fff)) goto LAB_00293fbd;
      piVar2[lVar5] = uVar1;
      bVar4 = 1 < lVar5;
      lVar5 = lVar5 + -1;
    } while (bVar4);
    lVar5 = 0;
  }
LAB_00293fbd:
  vEdges->pArray[(int)lVar5] = Edge;
  return;
}

Assistant:

void Abc_NodeEdgeDsdPushOrdered( Dec_Graph_t * pGraph, Vec_Int_t * vEdges, int Edge )
{
    int i, NodeOld, NodeNew;
    vEdges->nSize++;
    for ( i = vEdges->nSize-2; i >= 0; i-- )
    {
        NodeOld = Dec_IntToEdge(vEdges->pArray[i]).Node;
        NodeNew = Dec_IntToEdge(Edge).Node;
        // use <= because we are trying to push the new (non-existent) nodes as far as possible
        if ( Dec_GraphNode(pGraph, NodeOld)->Level <= Dec_GraphNode(pGraph, NodeNew)->Level )
            vEdges->pArray[i+1] = vEdges->pArray[i];
        else
            break;
    }
    vEdges->pArray[i+1] = Edge;
}